

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<std::complex<long_double>_>::Solve_LDLt
          (TPZMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *B,
          list<long,_std::allocator<long>_> *singular)

{
  int iVar1;
  
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1a])(this,singular);
  if (iVar1 != 0) {
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x46])(this,B);
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x48])(this,B);
    iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x47])(this,B);
    return iVar1;
  }
  return 0;
}

Assistant:

int TPZMatrix<TVar>::Solve_LDLt( TPZFMatrix<TVar>* B, std::list<int64_t> &singular ) {
    
    int result = Decompose_LDLt(singular);
    if (result == 0) {
        return result;
    }
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        B->Print("On input " , sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    Subst_LForward( B );
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        B->Print("Only forward " , sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    Subst_Diag( B );
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        B->Print("After forward and diagonal " , sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    result = Subst_LBackward( B );
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        B->Print("Final result " , sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    return result;
}